

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VecAttributesImpl.cpp
# Opt level: O3

XMLCh * __thiscall xercesc_4_0::VecAttributesImpl::getURI(VecAttributesImpl *this,XMLSize_t index)

{
  XMLScanner *this_00;
  XMLAttr *pXVar1;
  XMLCh *pXVar2;
  
  if (index < this->fCount) {
    this_00 = this->fScanner;
    pXVar1 = BaseRefVectorOf<xercesc_4_0::XMLAttr>::elementAt
                       (&this->fVector->super_BaseRefVectorOf<xercesc_4_0::XMLAttr>,index);
    pXVar2 = XMLScanner::getURIText(this_00,pXVar1->fAttName->fURIId);
    return pXVar2;
  }
  return (XMLCh *)0x0;
}

Assistant:

const XMLCh* VecAttributesImpl::getURI(const XMLSize_t index) const
{
    // since this func really needs to be const, like the rest, not sure how we
    // make it const and re-use the fURIBuffer member variable.  we're currently
    // creating a buffer each time you need a URI.  there has to be a better
    // way to do this...

    //XMLBuffer tempBuf;
    if (index >= fCount) {


        return 0;
     }
    //fValidator->getURIText(fVector->elementAt(index)->getURIId(), tempBuf) ;
    //return tempBuf.getRawBuffer() ;
    return fScanner->getURIText(fVector->elementAt(index)->getURIId());
}